

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speaker_positioning.c
# Opt level: O2

int speakers_within_set(int set,vbap_data *data)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  
  compute_set_matrix_3d(set,data);
  for (uVar2 = 0; uVar2 != data->speaker_count; uVar2 = uVar2 + 1) {
    if (((uVar2 != data->sets[set].speakers[0]) && (uVar2 != data->sets[set].speakers[1])) &&
       (uVar2 != data->sets[set].speakers[2])) {
      bVar1 = true;
      for (lVar3 = 0; lVar3 != 0x24; lVar3 = lVar3 + 0xc) {
        if (*(float *)((long)data->sets[set].inv_mat + lVar3 + 8) * data->speakers[uVar2][2] +
            *(float *)((long)data->sets[set].inv_mat + lVar3) * data->speakers[uVar2][0] +
            *(float *)((long)data->sets[set].inv_mat + lVar3 + 4) * data->speakers[uVar2][1] <
            -0.001) {
          bVar1 = false;
        }
      }
      if (bVar1) break;
    }
  }
  return (int)(uVar2 < data->speaker_count);
}

Assistant:

int speakers_within_set(int set, struct vbap_data *data){
  compute_set_matrix_3d(set, data);
  float *inv_mat = data->sets[set].inv_mat;
  int i = data->sets[set].speakers[0];
  int j = data->sets[set].speakers[1];
  int k = data->sets[set].speakers[2];
  for(int s=0; s<data->speaker_count; ++s){
    if(s != i && s != j && s != k){
      float *sp = data->speakers[s];
      char inside = 1;
      for(int t=0; t<3; ++t){
        float tmp = sp[0] * inv_mat[0 + t*3] +
                    sp[1] * inv_mat[1 + t*3] +
                    sp[2] * inv_mat[2 + t*3];
        if(tmp < -0.001) inside = 0;
      }
      if(inside) return 1;
    }
  }
  return 0;
}